

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcObject::~IfcObject(IfcObject *this)

{
  undefined1 *puVar1;
  
  *(undefined ***)this = &PTR__IfcObject_00886960;
  *(undefined ***)&this->field_0xd0 = &PTR__IfcObject_008869d8;
  *(undefined ***)&this->field_0x88 = &PTR__IfcObject_00886988;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcObject_008869b0;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x886af0;
  *(undefined8 *)&this->field_0xd0 = 0x886b18;
  if (*(undefined1 **)&this->field_0x60 != &this->field_0x70) {
    operator_delete(*(undefined1 **)&this->field_0x60);
  }
  if (*(undefined1 **)&this->field_0x38 != &this->field_0x48) {
    operator_delete(*(undefined1 **)&this->field_0x38);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcObject() : Object("IfcObject") {}